

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

void __thiscall Quat4f::setAxisAngle(Quat4f *this,float radians,Vector3f *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  
  dVar4 = cos((double)(radians * 0.5));
  this->m_elements[0] = (float)dVar4;
  dVar4 = sin((double)(radians * 0.5));
  fVar1 = (float)dVar4;
  fVar2 = Vector3f::length(axis);
  fVar2 = 1.0 / fVar2;
  fVar3 = Vector3f::x(axis);
  this->m_elements[1] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::y(axis);
  this->m_elements[2] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::z(axis);
  this->m_elements[3] = fVar3 * fVar1 * fVar2;
  return;
}

Assistant:

void Quat4f::setAxisAngle( float radians, const Vector3f& axis )
{
	m_elements[ 0 ] = cos( radians / 2 );

	float sinHalfTheta = sin( radians / 2 );
	float vectorNorm = axis.length();
	float reciprocalVectorNorm = 1.f / vectorNorm;

	m_elements[ 1 ] = axis.x() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 2 ] = axis.y() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 3 ] = axis.z() * sinHalfTheta * reciprocalVectorNorm;
}